

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O1

shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
 canonizeIRTTreesLinearize
           (shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
            *trees)

{
  _Rb_tree_header *p_Var1;
  CStatement *pCVar2;
  CStatement *pCVar3;
  IVisitor IVar4;
  mapped_type *pmVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long *in_RSI;
  _Rb_tree_node_base *p_Var7;
  undefined1 auVar8 [16];
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
  sVar9;
  CLinearizeVisitor linearizeVisitor;
  CStatement *local_40;
  CLinearizeVisitor local_38;
  
  local_38.super_IVisitor._vptr_IVisitor = (_func_int **)operator_new(0x30);
  p_Var1 = &(((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
               *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header;
  (((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
     *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
     *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)0x0;
  (((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
     *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header._M_header._M_right =
       (_Base_ptr)0x0;
  (((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
     *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)
   &((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
      *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl = 0;
  *(undefined8 *)
   &(((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
       *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header._M_header = 0;
  (((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
     *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
     *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
     *)local_38.super_IVisitor._vptr_IVisitor)->_M_impl).super__Rb_tree_header._M_node_count = 0;
  std::
  __shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,(__gnu_cxx::_Lock_policy)2>
  ::
  __shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,std::default_delete<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>>,void>
            ((__shared_ptr<std::map<std::__cxx11::string,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>>>>,(__gnu_cxx::_Lock_policy)2>
              *)trees,(unique_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_std::default_delete<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>_>
                       *)&local_38);
  IVar4._vptr_IVisitor = local_38.super_IVisitor._vptr_IVisitor;
  _Var6._M_pi = extraout_RDX;
  if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
       *)local_38.super_IVisitor._vptr_IVisitor !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
       *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
                 *)local_38.super_IVisitor._vptr_IVisitor);
    operator_delete(IVar4._vptr_IVisitor);
    _Var6._M_pi = extraout_RDX_00;
  }
  p_Var7 = *(_Rb_tree_node_base **)(*in_RSI + 0x18);
  if (p_Var7 != (_Rb_tree_node_base *)(*in_RSI + 8)) {
    do {
      pCVar3 = local_40;
      IRT::CLinearizeVisitor::CLinearizeVisitor(&local_38);
      (**(code **)**(undefined8 **)(p_Var7 + 2))(*(undefined8 **)(p_Var7 + 2),&local_38);
      IRT::CLinearizeVisitor::getResultTree(&local_38);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>
               ::operator[]((trees->
                            super___shared_ptr<const_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr,(key_type *)(p_Var7 + 1));
      local_40 = (CStatement *)0x0;
      pCVar2 = (pmVar5->_M_t).
               super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
               .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
      (pmVar5->_M_t).
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = pCVar3;
      if (pCVar2 != (CStatement *)0x0) {
        (**(code **)((long)(pCVar2->super_IStatement).super_INode + 0x10))();
      }
      IRT::CLinearizeVisitor::~CLinearizeVisitor(&local_38);
      auVar8 = std::_Rb_tree_increment(p_Var7);
      _Var6._M_pi = auVar8._8_8_;
      p_Var7 = auVar8._0_8_;
    } while (p_Var7 != (_Rb_tree_node_base *)(*in_RSI + 8));
  }
  sVar9.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var6._M_pi;
  sVar9.
  super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)trees;
  return (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
          )sVar9.
           super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<MethodToIRTMap> canonizeIRTTreesLinearize( std::shared_ptr<const MethodToIRTMap> trees ) {
    std::shared_ptr<MethodToIRTMap> newTrees = std::shared_ptr<MethodToIRTMap>(
            std::move( std::unique_ptr<MethodToIRTMap>( new MethodToIRTMap( ))));
    for ( auto tree = trees->begin( ); tree != trees->end( ); ++tree ) {

        IRT::CLinearizeVisitor linearizeVisitor;
        tree->second->Accept( linearizeVisitor );

        ( *newTrees )[ tree->first ] = std::move( linearizeVisitor.getResultTree( ));
    }

    return newTrees;
}